

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalKdevelopGenerator::MergeProjectFiles
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string tmp;
  cmGeneratedFileStream fout;
  ifstream oldProjectFile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&oldProjectFile,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_oldProjectFile + -0x18)] & 5) == 0) {
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    while (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&oldProjectFile,&tmp,(bool *)0x0,-1), bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lines,&tmp);
    }
    std::ifstream::close();
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false,None);
    if ((((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
          [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream[-3]] & 5) == 0) &&
       (pbVar5 = lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      do {
        pcVar4 = (pbVar5->_M_dataplus)._M_p;
        pcVar2 = strstr(pcVar4,"<projectdirectory>");
        if (((pcVar2 == (char *)0x0) &&
            (((pcVar2 = strstr(pcVar4,"<projectmanagement>"), pcVar2 == (char *)0x0 &&
              (pcVar2 = strstr(pcVar4,"<absoluteprojectpath>"), pcVar2 == (char *)0x0)) &&
             (pcVar2 = strstr(pcVar4,"<filelistdirectory>"), pcVar2 == (char *)0x0)))) &&
           ((pcVar2 = strstr(pcVar4,"<buildtool>"), pcVar2 == (char *)0x0 &&
            (pcVar2 = strstr(pcVar4,"<builddir>"), pcVar2 == (char *)0x0)))) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&fout,pcVar4,pbVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          pcVar2 = strstr(pcVar4,"<general>");
          if (pcVar2 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,
                       "  <projectmanagement>KDevCustomProject</projectmanagement>\n",0x3b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,"  <projectdirectory>",0x14);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&fout,(projectDir->_M_dataplus)._M_p,
                                projectDir->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</projectdirectory>\n",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,"  <absoluteprojectpath>true</absoluteprojectpath>\n",0x32);
          }
          pcVar2 = strstr(pcVar4,"<kdevcustomproject>");
          if (pcVar2 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,"    <filelistdirectory>",0x17);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&fout,(outputDir->_M_dataplus)._M_p,
                                outputDir->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</filelistdirectory>\n",0x15)
            ;
          }
          pcVar4 = strstr(pcVar4,"<build>");
          if (pcVar4 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,"      <buildtool>make</buildtool>\n",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fout,"      <builddir>",0x10);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&fout,(outputDir->_M_dataplus)._M_p,
                                outputDir->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</builddir>\n",0xc);
          }
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lines);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tmp._M_dataplus._M_p != &tmp.field_2) {
      operator_delete(tmp._M_dataplus._M_p,
                      CONCAT71(tmp.field_2._M_allocated_capacity._1_7_,tmp.field_2._M_local_buf[0])
                      + 1);
    }
  }
  else {
    CreateNewProjectFile
              (this,outputDir,projectDir,filename,executable,cmakeFilePattern,fileToOpen,
               sessionFilename);
  }
  std::ifstream::~ifstream(&oldProjectFile);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::MergeProjectFiles(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmsys::ifstream oldProjectFile(filename.c_str());
  if (!oldProjectFile) {
    this->CreateNewProjectFile(outputDir, projectDir, filename, executable,
                               cmakeFilePattern, fileToOpen, sessionFilename);
    return;
  }

  /* Read the existing project file (line by line), copy all lines
    into the new project file, except the ones which can be reliably
    set from contents of the CMakeLists.txt */
  std::string tmp;
  std::vector<std::string> lines;
  while (cmSystemTools::GetLineFromStream(oldProjectFile, tmp)) {
    lines.push_back(tmp);
  }
  oldProjectFile.close();

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  for (std::vector<std::string>::const_iterator it = lines.begin();
       it != lines.end(); it++) {
    const char* line = (*it).c_str();
    // skip these tags as they are always replaced
    if ((strstr(line, "<projectdirectory>") != CM_NULLPTR) ||
        (strstr(line, "<projectmanagement>") != CM_NULLPTR) ||
        (strstr(line, "<absoluteprojectpath>") != CM_NULLPTR) ||
        (strstr(line, "<filelistdirectory>") != CM_NULLPTR) ||
        (strstr(line, "<buildtool>") != CM_NULLPTR) ||
        (strstr(line, "<builddir>") != CM_NULLPTR)) {
      continue;
    }

    // output the line from the file if it is not one of the above tags
    fout << *it << "\n";
    // if this is the <general> tag output the stuff that goes in the
    // general tag
    if (strstr(line, "<general>")) {
      fout << "  <projectmanagement>KDevCustomProject</projectmanagement>\n";
      fout << "  <projectdirectory>" << projectDir
           << "</projectdirectory>\n"; // this one is important
      fout << "  <absoluteprojectpath>true</absoluteprojectpath>\n";
      // and this one
    }
    // inside kdevcustomproject the <filelistdirectory> must be put
    if (strstr(line, "<kdevcustomproject>")) {
      fout << "    <filelistdirectory>" << outputDir
           << "</filelistdirectory>\n";
    }
    // buildtool and builddir go inside <build>
    if (strstr(line, "<build>")) {
      fout << "      <buildtool>make</buildtool>\n";
      fout << "      <builddir>" << outputDir << "</builddir>\n";
    }
  }
}